

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

void __thiscall RealCommandRunner::RealCommandRunner(RealCommandRunner *this,BuildConfig *config)

{
  uint uVar1;
  TokenPool *pTVar2;
  BuildConfig *config_local;
  RealCommandRunner *this_local;
  
  CommandRunner::CommandRunner(&this->super_CommandRunner);
  (this->super_CommandRunner)._vptr_CommandRunner = (_func_int **)&PTR__RealCommandRunner_002a9848;
  this->config_ = config;
  SubprocessSet::SubprocessSet(&this->subprocs_);
  std::
  map<const_Subprocess_*,_Edge_*,_std::less<const_Subprocess_*>,_std::allocator<std::pair<const_Subprocess_*const,_Edge_*>_>_>
  ::map(&this->subproc_to_edge_);
  this->max_load_average_ = config->max_load_average;
  pTVar2 = TokenPool::Get();
  this->tokens_ = pTVar2;
  if ((pTVar2 != (TokenPool *)0x0) &&
     (uVar1 = (*this->tokens_->_vptr_TokenPool[6])
                        (this->tokens_,(ulong)(this->config_->parallelism_from_cmdline & 1),
                         (ulong)(this->config_->verbosity == VERBOSE),&this->max_load_average_),
     (uVar1 & 1) == 0)) {
    if (this->tokens_ != (TokenPool *)0x0) {
      (*this->tokens_->_vptr_TokenPool[1])();
    }
    this->tokens_ = (TokenPool *)0x0;
  }
  return;
}

Assistant:

RealCommandRunner::RealCommandRunner(const BuildConfig& config) : config_(config) {
  max_load_average_ = config.max_load_average;
  if ((tokens_ = TokenPool::Get()) != NULL) {
    if (!tokens_->Setup(config_.parallelism_from_cmdline,
                        config_.verbosity == BuildConfig::VERBOSE,
                        max_load_average_)) {
      delete tokens_;
      tokens_ = NULL;
    }
  }
}